

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::TableImport::~TableImport(TableImport *this)

{
  TableImport *this_local;
  
  ~TableImport(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

explicit TableImport(std::string_view name = std::string_view())
      : ImportMixin<ExternalKind::Table>(), table(name) {}